

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldMessage(ParserImpl *this)

{
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  int iVar1;
  bool bVar2;
  __type_conflict _Var3;
  string_view message;
  string delimiter;
  allocator<char> local_e1;
  undefined1 local_e0 [48];
  undefined1 local_b0 [32];
  AlphaNum local_90;
  string_view local_60;
  
  iVar1 = this->recursion_limit_;
  this->recursion_limit_ = iVar1 + -1;
  if (iVar1 < 1) {
    local_e0._0_16_ =
         (undefined1  [16])
         absl::lts_20240722::NullSafeStringView
                   ("Message is too deep, the parser exceeded the configured recursion limit of ");
    absl::lts_20240722::AlphaNum::AlphaNum
              ((AlphaNum *)(local_b0 + 0x20),this->initial_recursion_limit_);
    local_60 = absl::lts_20240722::NullSafeStringView(".");
    absl::lts_20240722::StrCat_abi_cxx11_
              ((AlphaNum *)local_b0,(AlphaNum *)local_e0,(AlphaNum *)(local_b0 + 0x20));
    message._M_str = (char *)local_b0._0_8_;
    message._M_len = local_b0._8_8_;
    ReportError(this,message);
    std::__cxx11::string::~string((string *)local_b0);
    bVar2 = false;
  }
  else {
    local_e0._8_8_ = 0;
    local_e0._0_8_ = local_e0 + 0x10;
    local_e0[0x10] = '\0';
    bVar2 = ConsumeMessageDelimiter(this,(string *)local_e0);
    if (bVar2) {
      __lhs = &(this->tokenizer_).current_.text;
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b0 + 0x20)
      ;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__rhs,">",(allocator<char> *)local_b0);
        _Var3 = std::operator==(__lhs,__rhs);
        if (_Var3) {
          std::__cxx11::string::~string((string *)(local_b0 + 0x20));
LAB_002ca288:
          bVar2 = Consume(this,(string *)local_e0);
          if (bVar2) {
            this->recursion_limit_ = this->recursion_limit_ + 1;
            bVar2 = true;
            goto LAB_002ca2a5;
          }
          break;
        }
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"}",&local_e1);
        _Var3 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)__rhs);
        if (_Var3) goto LAB_002ca288;
        bVar2 = SkipField(this);
      } while (bVar2);
    }
    bVar2 = false;
LAB_002ca2a5:
    std::__cxx11::string::~string((string *)local_e0);
  }
  return bVar2;
}

Assistant:

bool SkipFieldMessage() {
    if (--recursion_limit_ < 0) {
      ReportError(
          absl::StrCat("Message is too deep, the parser exceeded the "
                       "configured recursion limit of ",
                       initial_recursion_limit_, "."));
      return false;
    }

    std::string delimiter;
    DO(ConsumeMessageDelimiter(&delimiter));
    while (!LookingAt(">") && !LookingAt("}")) {
      DO(SkipField());
    }
    DO(Consume(delimiter));

    ++recursion_limit_;
    return true;
  }